

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::extractClassName_abi_cxx11_
          (string *__return_storage_ptr__,Catch *this,StringRef *classOrQualifiedMethodName)

{
  bool bVar1;
  string local_60 [32];
  long local_40;
  size_t penultimateColons;
  undefined8 local_28;
  size_t lastColons;
  Catch *local_18;
  StringRef *classOrQualifiedMethodName_local;
  string *className;
  
  lastColons._7_1_ = 0;
  local_18 = this;
  classOrQualifiedMethodName_local = (StringRef *)__return_storage_ptr__;
  StringRef::operator_cast_to_string(__return_storage_ptr__,(StringRef *)this);
  bVar1 = startsWith(__return_storage_ptr__,'&');
  if (bVar1) {
    local_28 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x1ec94c);
    local_40 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x1ec94c);
    if (local_40 == -1) {
      local_40 = 1;
    }
    std::__cxx11::string::substr((ulong)local_60,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_60);
    std::__cxx11::string::~string(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string extractClassName( StringRef const& classOrQualifiedMethodName ) {
        std::string className(classOrQualifiedMethodName);
        if( startsWith( className, '&' ) )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }